

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O3

size_t scriptint_to_bytes(int64_t signed_v,uchar *bytes_out)

{
  bool bVar1;
  uchar uVar2;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  
  if (signed_v == 0) {
    return 0;
  }
  uVar5 = -signed_v;
  if (0 < signed_v) {
    uVar5 = signed_v;
  }
  sVar4 = 0;
  do {
    sVar3 = sVar4;
    uVar2 = (uchar)uVar5;
    bytes_out[sVar3] = uVar2;
    sVar4 = sVar3 + 1;
    bVar1 = 0xff < uVar5;
    uVar5 = uVar5 >> 8;
  } while (bVar1);
  if (-1 < (char)uVar2) {
    if (-1 < signed_v) {
      return sVar4;
    }
    bytes_out[sVar3] = bytes_out[sVar3] | 0x80;
    return sVar4;
  }
  bytes_out[sVar4] = (byte)((ulong)signed_v >> 0x38) & 0x80;
  return sVar3 + 2;
}

Assistant:

size_t scriptint_to_bytes(int64_t signed_v, unsigned char *bytes_out)
{
    uint64_t v = signed_v < 0 ? -signed_v : signed_v;
    size_t len = 0;
    unsigned char last = 0;

    while (v) {
        last = v & 0xff;
        *bytes_out++ = last;
        len += 1;
        v >>= 8;
    }
    if (last & 0x80) {
        *bytes_out = signed_v < 0 ? 0x80 : 0;
        ++len;
    } else if (signed_v < 0)
        bytes_out[-1] |= 0x80;
    return len;
}